

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

Data parseWatsonFromString(char *str,size_t len)

{
  VM vm_00;
  Data pvVar1;
  Data d;
  size_t i;
  VM vm;
  size_t len_local;
  char *str_local;
  
  vm_00 = newBufferVM(LexerA,str,len);
  for (d = (Data)0x0; d < len; d = (Data)((long)&d->val + 1)) {
    parseCommand(vm_00,str[(long)d]);
  }
  pvVar1 = pop(vm_00->stack);
  freeVM(vm_00);
  return pvVar1;
}

Assistant:

Data parseWatsonFromString(const char *str, size_t len) {
    VM vm = newBufferVM(LexerA, (char *) str, len);
    size_t i;
    for (i = 0; i < len; i++)parseCommand(vm, str[i]);
    Data d = pop(vm->stack);
    freeVM(vm);
    return d;
}